

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O1

RecyclerWeakReferenceBase * __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::Add
          (WeakReferenceHashTable<PrimePolicy> *this,char *strongReference,Recycler *recycler)

{
  hash_t targetBucket;
  RecyclerWeakReferenceBase *pRVar1;
  
  targetBucket = PrimePolicy::ModPrime
                           ((hash_t)((ulong)strongReference >> 4),this->size,this->modFunctionIndex)
  ;
  for (pRVar1 = this->buckets[targetBucket];
      (pRVar1 != (RecyclerWeakReferenceBase *)0x0 && (pRVar1->strongRef != strongReference));
      pRVar1 = pRVar1->next) {
  }
  if (pRVar1 != (RecyclerWeakReferenceBase *)0x0) {
    return pRVar1;
  }
  pRVar1 = Create(this,strongReference,targetBucket,recycler);
  return pRVar1;
}

Assistant:

RecyclerWeakReferenceBase* Add(char* strongReference, Recycler * recycler)
    {
        uint targetBucket = HashKeyToBucket(strongReference, size);
        RecyclerWeakReferenceBase* entry = FindEntry(strongReference, targetBucket);
        if (entry != nullptr)
        {
            return entry;
        }

        return Create(strongReference, targetBucket, recycler);
    }